

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O3

void soplex::
     SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ::computeEquiExpVec(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *vecset,DataArray<int> *coScaleExp,DataArray<int> *scaleExp,
                        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *epsilon)

{
  Item *pIVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  double __x;
  uint uVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined4 *puVar9;
  uint *puVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  uint *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  soplex *psVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  char cVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  byte bVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_3b8;
  cpp_dec_float<200U,_int,_void> local_338;
  cpp_dec_float<200U,_int,_void> local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_230;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  soplex local_b0 [112];
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar20 = 0;
  if (0 < (vecset->set).thenum) {
    lVar18 = 0;
    do {
      pIVar1 = (vecset->set).theitem;
      iVar7 = (vecset->set).thekey[lVar18].idx;
      local_338.fpclass = cpp_dec_float_finite;
      local_338.prec_elem = 0x1c;
      local_338.data._M_elems[0] = 0;
      local_338.data._M_elems[1] = 0;
      local_338.data._M_elems[2] = 0;
      local_338.data._M_elems[3] = 0;
      local_338.data._M_elems[4] = 0;
      local_338.data._M_elems[5] = 0;
      local_338.data._M_elems[6] = 0;
      local_338.data._M_elems[7] = 0;
      local_338.data._M_elems[8] = 0;
      local_338.data._M_elems[9] = 0;
      local_338.data._M_elems[10] = 0;
      local_338.data._M_elems[0xb] = 0;
      local_338.data._M_elems[0xc] = 0;
      local_338.data._M_elems[0xd] = 0;
      local_338.data._M_elems[0xe] = 0;
      local_338.data._M_elems[0xf] = 0;
      local_338.data._M_elems[0x10] = 0;
      local_338.data._M_elems[0x11] = 0;
      local_338.data._M_elems[0x12] = 0;
      local_338.data._M_elems[0x13] = 0;
      local_338.data._M_elems[0x14] = 0;
      local_338.data._M_elems[0x15] = 0;
      local_338.data._M_elems[0x16] = 0;
      local_338.data._M_elems[0x17] = 0;
      local_338.data._M_elems[0x18] = 0;
      local_338.data._M_elems[0x19] = 0;
      local_338.data._M_elems._104_5_ = 0;
      local_338.data._M_elems[0x1b]._1_3_ = 0;
      local_338.exp = 0;
      local_338.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_338,0.0);
      if (0 < pIVar1[iVar7].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar1 = pIVar1 + iVar7;
        lVar19 = 0;
        lVar17 = 0;
        do {
          pNVar2 = (pIVar1->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar9 = (undefined4 *)((long)&(pNVar2->val).m_backend.data + lVar19);
          psVar14 = local_b0;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            *(undefined4 *)psVar14 = *puVar9;
            puVar9 = puVar9 + (ulong)bVar20 * -2 + 1;
            psVar14 = psVar14 + (ulong)bVar20 * -8 + 4;
          }
          local_40 = *(undefined4 *)((long)&(pNVar2->val).m_backend.data + lVar19 + 0x70);
          local_3c = *(undefined1 *)((long)&(pNVar2->val).m_backend.data + lVar19 + 0x74);
          local_38 = *(undefined8 *)((long)&(pNVar2->val).m_backend.data + lVar19 + 0x78);
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                    (&local_230,local_b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)(uint)coScaleExp->data
                                     [*(int *)((long)(&((pIVar1->data).
                                                                                                                
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar19)],
                     (int)coScaleExp->data);
          iVar5 = local_230.m_backend.prec_elem;
          fVar4 = local_230.m_backend.fpclass;
          iVar7 = local_230.m_backend.exp;
          uVar3 = local_230.m_backend.data._M_elems[0];
          cVar16 = local_230.m_backend.neg;
          if (local_230.m_backend.neg == true) {
            cVar16 = local_230.m_backend.fpclass == cpp_dec_float_finite &&
                     local_230.m_backend.data._M_elems[0] == 0;
          }
          puVar12 = local_230.m_backend.data._M_elems + 1;
          puVar10 = puVar12;
          pcVar13 = &local_2b8;
          for (lVar8 = 0x1b; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar13->data)._M_elems[0] = *puVar10;
            puVar10 = puVar10 + (ulong)bVar20 * -2 + 1;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar20 * -8 + 4);
          }
          pcVar13 = &local_338;
          pcVar15 = &local_130;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar20 * -8 + 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
          }
          local_130.exp = local_338.exp;
          local_130.neg = local_338.neg;
          local_130.fpclass = local_338.fpclass;
          local_130.prec_elem = local_338.prec_elem;
          pnVar11 = epsilon;
          pcVar13 = &local_1b0;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar13->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar20 * -2 + 1) * 4);
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          local_1b0.exp = (epsilon->m_backend).exp;
          local_1b0.neg = (epsilon->m_backend).neg;
          local_1b0.fpclass = (epsilon->m_backend).fpclass;
          local_1b0.prec_elem = (epsilon->m_backend).prec_elem;
          local_3b8.data._M_elems[0] = uVar3;
          puVar10 = local_3b8.data._M_elems + 1;
          for (lVar8 = 0x1b; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar10 = *puVar12;
            puVar12 = puVar12 + (ulong)bVar20 * -2 + 1;
            puVar10 = puVar10 + (ulong)bVar20 * -2 + 1;
          }
          local_3b8.exp = iVar7;
          local_3b8.prec_elem = iVar5;
          local_3b8.fpclass = fVar4;
          local_3b8.neg = (bool)cVar16;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_3b8,&local_130);
          if (((local_3b8.fpclass != cpp_dec_float_NaN) && (local_1b0.fpclass != cpp_dec_float_NaN))
             && (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_3b8,&local_1b0), 0 < iVar6)) {
            local_338.data._M_elems[0] = uVar3;
            pcVar13 = &local_2b8;
            puVar12 = local_338.data._M_elems + 1;
            for (lVar8 = 0x1b; lVar8 != 0; lVar8 = lVar8 + -1) {
              *puVar12 = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar20 * -8 + 4);
              puVar12 = puVar12 + (ulong)bVar20 * -2 + 1;
            }
            local_338.exp = iVar7;
            local_338.prec_elem = iVar5;
            local_338.fpclass = fVar4;
            local_338.neg = (bool)cVar16;
          }
          lVar17 = lVar17 + 1;
          lVar19 = lVar19 + 0x84;
        } while (lVar17 < (pIVar1->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      if (local_338.fpclass != cpp_dec_float_NaN) {
        local_3b8.fpclass = cpp_dec_float_finite;
        local_3b8.prec_elem = 0x1c;
        local_3b8.data._M_elems[0] = 0;
        local_3b8.data._M_elems[1] = 0;
        local_3b8.data._M_elems[2] = 0;
        local_3b8.data._M_elems[3] = 0;
        local_3b8.data._M_elems[4] = 0;
        local_3b8.data._M_elems[5] = 0;
        local_3b8.data._M_elems[6] = 0;
        local_3b8.data._M_elems[7] = 0;
        local_3b8.data._M_elems[8] = 0;
        local_3b8.data._M_elems[9] = 0;
        local_3b8.data._M_elems[10] = 0;
        local_3b8.data._M_elems[0xb] = 0;
        local_3b8.data._M_elems[0xc] = 0;
        local_3b8.data._M_elems[0xd] = 0;
        local_3b8.data._M_elems[0xe] = 0;
        local_3b8.data._M_elems[0xf] = 0;
        local_3b8.data._M_elems[0x10] = 0;
        local_3b8.data._M_elems[0x11] = 0;
        local_3b8.data._M_elems[0x12] = 0;
        local_3b8.data._M_elems[0x13] = 0;
        local_3b8.data._M_elems[0x14] = 0;
        local_3b8.data._M_elems[0x15] = 0;
        local_3b8.data._M_elems[0x16] = 0;
        local_3b8.data._M_elems[0x17] = 0;
        local_3b8.data._M_elems[0x18] = 0;
        local_3b8.data._M_elems[0x19] = 0;
        local_3b8.data._M_elems._104_5_ = 0;
        local_3b8.data._M_elems[0x1b]._1_3_ = 0;
        local_3b8.exp = 0;
        local_3b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3b8,0.0);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_338,&local_3b8);
        if (iVar7 == 0) {
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_338,1.0);
        }
      }
      local_2b8.fpclass = cpp_dec_float_finite;
      local_2b8.prec_elem = 0x1c;
      local_2b8.data._M_elems[0] = 0;
      local_2b8.data._M_elems[1] = 0;
      local_2b8.data._M_elems[2] = 0;
      local_2b8.data._M_elems[3] = 0;
      local_2b8.data._M_elems[4] = 0;
      local_2b8.data._M_elems[5] = 0;
      local_2b8.data._M_elems[6] = 0;
      local_2b8.data._M_elems[7] = 0;
      local_2b8.data._M_elems[8] = 0;
      local_2b8.data._M_elems[9] = 0;
      local_2b8.data._M_elems[10] = 0;
      local_2b8.data._M_elems[0xb] = 0;
      local_2b8.data._M_elems[0xc] = 0;
      local_2b8.data._M_elems[0xd] = 0;
      local_2b8.data._M_elems[0xe] = 0;
      local_2b8.data._M_elems[0xf] = 0;
      local_2b8.data._M_elems[0x10] = 0;
      local_2b8.data._M_elems[0x11] = 0;
      local_2b8.data._M_elems[0x12] = 0;
      local_2b8.data._M_elems[0x13] = 0;
      local_2b8.data._M_elems[0x14] = 0;
      local_2b8.data._M_elems[0x15] = 0;
      local_2b8.data._M_elems[0x16] = 0;
      local_2b8.data._M_elems[0x17] = 0;
      local_2b8.data._M_elems[0x18] = 0;
      local_2b8.data._M_elems[0x19] = 0;
      local_2b8.data._M_elems._104_5_ = 0;
      local_2b8.data._M_elems[0x1b]._1_3_ = 0;
      local_2b8.exp = 0;
      local_2b8.neg = false;
      local_3b8.fpclass = cpp_dec_float_finite;
      local_3b8.prec_elem = 0x1c;
      local_3b8.data._M_elems[0] = 0;
      local_3b8.data._M_elems[1] = 0;
      local_3b8.data._M_elems[2] = 0;
      local_3b8.data._M_elems[3] = 0;
      local_3b8.data._M_elems[4] = 0;
      local_3b8.data._M_elems[5] = 0;
      local_3b8.data._M_elems[6] = 0;
      local_3b8.data._M_elems[7] = 0;
      local_3b8.data._M_elems[8] = 0;
      local_3b8.data._M_elems[9] = 0;
      local_3b8.data._M_elems[10] = 0;
      local_3b8.data._M_elems[0xb] = 0;
      local_3b8.data._M_elems[0xc] = 0;
      local_3b8.data._M_elems[0xd] = 0;
      local_3b8.data._M_elems[0xe] = 0;
      local_3b8.data._M_elems[0xf] = 0;
      local_3b8.data._M_elems[0x10] = 0;
      local_3b8.data._M_elems[0x11] = 0;
      local_3b8.data._M_elems[0x12] = 0;
      local_3b8.data._M_elems[0x13] = 0;
      local_3b8.data._M_elems[0x14] = 0;
      local_3b8.data._M_elems[0x15] = 0;
      local_3b8.data._M_elems[0x16] = 0;
      local_3b8.data._M_elems[0x17] = 0;
      local_3b8.data._M_elems[0x18] = 0;
      local_3b8.data._M_elems[0x19] = 0;
      local_3b8.data._M_elems._104_5_ = 0;
      local_3b8.data._M_elems[0x1b]._1_3_ = 0;
      local_3b8.exp = 0;
      local_3b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_3b8,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_2b8,&local_3b8,&local_338);
      __x = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                      (&local_2b8);
      frexp(__x,scaleExp->data + lVar18);
      scaleExp->data[lVar18] = scaleExp->data[lVar18] + -1;
      lVar18 = lVar18 + 1;
    } while (lVar18 < (vecset->set).thenum);
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::computeEquiExpVec(const SVSetBase<R>* vecset, const DataArray<int>& coScaleExp,
                                       DataArray<int>& scaleExp, R epsilon)
{
   assert(vecset != nullptr);

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(spxLdexp(vec.value(j), coScaleExp[vec.index(j)]));

         if(GT(x, maxi, epsilon))
            maxi = x;
      }

      // empty rows/cols are possible
      if(maxi == 0.0)
         maxi = 1.0;

      assert(maxi > 0.0);

      spxFrexp(Real(1.0 / maxi), &(scaleExp[i]));

      scaleExp[i] -= 1;
   }
}